

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::ObjectIntersector1<false>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  ulong uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  RTCIntersectFunctionN p_Var13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int mask;
  NodeRef stack [564];
  ulong *local_1360;
  int local_1354;
  RayQueryContext *local_1350;
  ulong local_1348;
  Ray *local_1340;
  Scene *local_1338;
  long local_1330;
  long local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  uint uVar25;
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar23._8_4_ = 0x7fffffff;
      auVar23._0_8_ = 0x7fffffff7fffffff;
      auVar23._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx((undefined1  [16])aVar2,auVar23);
      auVar27._8_4_ = 0x219392ef;
      auVar27._0_8_ = 0x219392ef219392ef;
      auVar27._12_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar23,auVar27,1);
      auVar23 = vblendvps_avx((undefined1  [16])aVar2,auVar27,auVar23);
      local_1360 = local_11d0;
      auVar27 = vrcpps_avx(auVar23);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar23 = vfnmadd231ps_fma(auVar28,auVar27,auVar23);
      auVar7 = vfmadd132ps_fma(auVar23,auVar27,auVar27);
      fVar26 = auVar7._0_4_;
      local_11f8._4_4_ = fVar26;
      local_11f8._0_4_ = fVar26;
      local_11f8._8_4_ = fVar26;
      local_11f8._12_4_ = fVar26;
      local_11f8._16_4_ = fVar26;
      local_11f8._20_4_ = fVar26;
      local_11f8._24_4_ = fVar26;
      local_11f8._28_4_ = fVar26;
      auVar34 = ZEXT3264(local_11f8);
      auVar23 = vmovshdup_avx(auVar7);
      uVar22 = auVar23._0_8_;
      local_1218._8_8_ = uVar22;
      local_1218._0_8_ = uVar22;
      local_1218._16_8_ = uVar22;
      local_1218._24_8_ = uVar22;
      auVar35 = ZEXT3264(local_1218);
      auVar28 = vshufpd_avx(auVar7,auVar7,1);
      auVar27 = vshufps_avx(auVar7,auVar7,0xaa);
      uVar22 = auVar27._0_8_;
      local_1238._8_8_ = uVar22;
      local_1238._0_8_ = uVar22;
      local_1238._16_8_ = uVar22;
      local_1238._24_8_ = uVar22;
      auVar36 = ZEXT3264(local_1238);
      auVar29._0_4_ = fVar26 * (ray->org).field_0.m128[0];
      auVar29._4_4_ = auVar7._4_4_ * (ray->org).field_0.m128[1];
      auVar29._8_4_ = auVar7._8_4_ * (ray->org).field_0.m128[2];
      auVar29._12_4_ = auVar7._12_4_ * (ray->org).field_0.m128[3];
      auVar27 = vmovshdup_avx(auVar29);
      auVar7 = vshufps_avx(auVar29,auVar29,0xaa);
      uVar17 = (ulong)(fVar26 < 0.0) << 5;
      uVar19 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
      uVar16 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
      uVar18 = uVar17 ^ 0x20;
      uVar14 = CONCAT44(auVar29._0_4_,auVar29._0_4_);
      local_1258._0_8_ = uVar14 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar29._0_4_;
      local_1258._12_4_ = -auVar29._0_4_;
      local_1258._16_4_ = -auVar29._0_4_;
      local_1258._20_4_ = -auVar29._0_4_;
      local_1258._24_4_ = -auVar29._0_4_;
      local_1258._28_4_ = -auVar29._0_4_;
      auVar32 = ZEXT3264(local_1258);
      uVar11 = auVar27._0_4_;
      uVar25 = auVar27._4_4_;
      local_1278._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar11 ^ 0x80000000;
      local_1278._12_4_ = uVar25 ^ 0x80000000;
      local_1278._16_4_ = uVar11 ^ 0x80000000;
      local_1278._20_4_ = uVar25 ^ 0x80000000;
      local_1278._24_4_ = uVar11 ^ 0x80000000;
      local_1278._28_4_ = uVar25 ^ 0x80000000;
      auVar24 = ZEXT3264(local_1278);
      uVar11 = auVar7._0_4_;
      uVar25 = auVar7._4_4_;
      local_1298._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar11 ^ 0x80000000;
      local_1298._12_4_ = uVar25 ^ 0x80000000;
      local_1298._16_4_ = uVar11 ^ 0x80000000;
      local_1298._20_4_ = uVar25 ^ 0x80000000;
      local_1298._24_4_ = uVar11 ^ 0x80000000;
      local_1298._28_4_ = uVar25 ^ 0x80000000;
      auVar30 = ZEXT3264(local_1298);
      uVar21 = auVar3._0_4_;
      local_12b8._4_4_ = uVar21;
      local_12b8._0_4_ = uVar21;
      local_12b8._8_4_ = uVar21;
      local_12b8._12_4_ = uVar21;
      local_12b8._16_4_ = uVar21;
      local_12b8._20_4_ = uVar21;
      local_12b8._24_4_ = uVar21;
      local_12b8._28_4_ = uVar21;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar1;
      local_12d8._0_4_ = fVar1;
      local_12d8._8_4_ = fVar1;
      local_12d8._12_4_ = fVar1;
      local_12d8._16_4_ = fVar1;
      local_12d8._20_4_ = fVar1;
      local_12d8._24_4_ = fVar1;
      local_12d8._28_4_ = fVar1;
      auVar33 = ZEXT3264(local_12d8);
      local_1350 = context;
      local_1348 = uVar17;
      local_1340 = ray;
      do {
        uVar14 = local_1360[-1];
        local_1360 = local_1360 + -1;
        while ((uVar14 & 8) == 0) {
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar17),auVar32._0_32_,
                                    auVar34._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar19),auVar24._0_32_,
                                   auVar35._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar3));
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar16),auVar30._0_32_,
                                    auVar36._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar23),auVar31._0_32_);
          auVar4 = vpmaxsd_avx2(auVar4,auVar5);
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + uVar18),auVar32._0_32_,
                                    auVar34._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + (uVar19 ^ 0x20)),
                                   auVar24._0_32_,auVar35._0_32_);
          auVar5 = vpminsd_avx2(ZEXT1632(auVar23),ZEXT1632(auVar3));
          auVar23 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar14 + 0x40 + (uVar16 ^ 0x20)),
                                    auVar30._0_32_,auVar36._0_32_);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar23),auVar33._0_32_);
          auVar5 = vpminsd_avx2(auVar5,auVar6);
          auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
          iVar10 = vmovmskps_avx(auVar4);
          if (iVar10 == 0xff) goto LAB_004d5188;
          bVar9 = ~(byte)iVar10;
          uVar8 = uVar14 & 0xfffffffffffffff0;
          lVar15 = 0;
          for (uVar14 = (ulong)bVar9; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
          {
            lVar15 = lVar15 + 1;
          }
          uVar14 = *(ulong *)(uVar8 + lVar15 * 8);
          uVar11 = bVar9 - 1 & (uint)bVar9;
          uVar12 = (ulong)uVar11;
          if (uVar11 != 0) {
            *local_1360 = uVar14;
            lVar15 = 0;
            for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar11 = uVar11 - 1 & uVar11;
            uVar12 = (ulong)uVar11;
            bVar20 = uVar11 == 0;
            while( true ) {
              local_1360 = local_1360 + 1;
              uVar14 = *(ulong *)(uVar8 + lVar15 * 8);
              if (bVar20) break;
              *local_1360 = uVar14;
              lVar15 = 0;
              for (uVar14 = uVar12; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar12 = uVar12 - 1 & uVar12;
              bVar20 = uVar12 == 0;
            }
          }
        }
        local_1330 = (ulong)((uint)uVar14 & 0xf) - 8;
        if (local_1330 != 0) {
          local_1338 = local_1350->scene;
          local_1328 = 0;
          do {
            local_1320.geomID = *(uint *)((uVar14 & 0xfffffffffffffff0) + local_1328 * 8);
            local_12f0 = (local_1338->geometries).items[local_1320.geomID].ptr;
            if ((ray->mask & local_12f0->mask) != 0) {
              local_1320.primID = *(uint *)((uVar14 & 0xfffffffffffffff0) + 4 + local_1328 * 8);
              local_1354 = -1;
              local_1320.valid = &local_1354;
              local_1320.geometryUserPtr = local_12f0->userPtr;
              local_1320.context = local_1350->user;
              local_1320.N = 1;
              local_12e8 = 0;
              local_12e0 = local_1350->args;
              p_Var13 = local_12e0->intersect;
              if (p_Var13 == (RTCIntersectFunctionN)0x0) {
                p_Var13 = (RTCIntersectFunctionN)
                          local_12f0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                          ._M_i;
              }
              local_1320.rayhit = (RTCRayHitN *)ray;
              (*p_Var13)(&local_1320);
              auVar34 = ZEXT3264(local_11f8);
              auVar35 = ZEXT3264(local_1218);
              auVar36 = ZEXT3264(local_1238);
              auVar32 = ZEXT3264(local_1258);
              auVar24 = ZEXT3264(local_1278);
              auVar30 = ZEXT3264(local_1298);
              auVar31 = ZEXT3264(local_12b8);
              auVar33 = ZEXT3264(local_12d8);
              ray = local_1340;
              uVar17 = local_1348;
              if (local_1340->tfar < 0.0) {
                local_1340->tfar = -INFINITY;
                return;
              }
            }
            local_1328 = local_1328 + 1;
          } while (local_1330 != local_1328);
        }
LAB_004d5188:
      } while (local_1360 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }